

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::BlendFactorForSide<double>
               (int *side,TPZVec<double> *xiVec,double *blendFactor,TPZVec<double> *blendFactorDxi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ostream *this;
  long lVar5;
  int64_t iVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  TPZVec<double> *in_RCX;
  double *in_RDX;
  TPZVec<double> *in_RSI;
  undefined4 *in_RDI;
  double dVar11;
  double *zeta;
  double *eta;
  double *xi;
  int i;
  REAL tol;
  size_t in_stack_00000348;
  char *in_stack_00000350;
  TPZVec<double> *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  undefined8 local_40;
  int local_34;
  REAL local_30;
  undefined8 local_28;
  TPZVec<double> *local_20;
  double *local_18;
  TPZVec<double> *local_10;
  undefined4 *local_8;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*in_RCX->_vptr_TPZVec[2])(in_RCX,3,&local_28);
  *local_18 = 0.0;
  local_30 = GetTolerance();
  bVar4 = CheckProjectionForSingularity<double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
  ;
  if (bVar4) {
    local_40 = 0;
    (*local_20->_vptr_TPZVec[2])(local_20,3,&local_40);
    pdVar7 = TPZVec<double>::operator[](local_10,0);
    pdVar8 = TPZVec<double>::operator[](local_10,1);
    pdVar9 = TPZVec<double>::operator[](local_10,2);
    switch(*local_8) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      *local_18 = 0.0;
      break;
    case 6:
      *local_18 = (1.0 - *pdVar9) * 0.5 * (1.0 - *pdVar8) * (1.0 - *pdVar8);
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      dVar11 = *pdVar8;
      dVar3 = *pdVar9;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = (1.0 - dVar11) * -1.0 * (1.0 - dVar3);
      dVar11 = *pdVar8;
      dVar3 = *pdVar8;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = (1.0 - dVar11) * (1.0 - dVar3) * -0.5;
      break;
    case 7:
      *local_18 = (1.0 - *pdVar9) * 0.5 * (*pdVar7 + *pdVar8) * (*pdVar7 + *pdVar8);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar9;
      pdVar10 = TPZVec<double>::operator[](local_20,0);
      *pdVar10 = (dVar11 + dVar3) * 1.0 * (1.0 - dVar1);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar9;
      pdVar9 = TPZVec<double>::operator[](local_20,1);
      *pdVar9 = (dVar11 + dVar3) * 1.0 * (1.0 - dVar1);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar8;
      dVar2 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = (dVar11 + dVar3) * (dVar1 + dVar2) * -0.5;
      break;
    case 8:
      *local_18 = (1.0 - *pdVar9) * 0.5 * (1.0 - *pdVar7) * (1.0 - *pdVar7);
      dVar11 = (1.0 - *pdVar7) * -1.0 * (1.0 - *pdVar9);
      pdVar8 = TPZVec<double>::operator[](local_20,0);
      *pdVar8 = dVar11;
      pdVar8 = TPZVec<double>::operator[](local_20,1);
      *pdVar8 = 0.0;
      dVar11 = *pdVar7;
      dVar3 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = (1.0 - dVar11) * (1.0 - dVar3) * -0.5;
      break;
    case 9:
      *local_18 = (1.0 - *pdVar7) - *pdVar8;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = -1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = -1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 10:
      *local_18 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 0xb:
      *local_18 = *pdVar8;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 0xc:
      *local_18 = (*pdVar9 + 1.0) * 0.5 * (1.0 - *pdVar8) * (1.0 - *pdVar8);
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      dVar11 = *pdVar8;
      dVar3 = *pdVar9;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = (1.0 - dVar11) * -1.0 * (dVar3 + 1.0);
      dVar11 = (1.0 - *pdVar8) * (1.0 - *pdVar8) * 0.5;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = dVar11;
      break;
    case 0xd:
      *local_18 = (*pdVar9 + 1.0) * 0.5 * (*pdVar7 + *pdVar8) * (*pdVar7 + *pdVar8);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar9;
      pdVar10 = TPZVec<double>::operator[](local_20,0);
      *pdVar10 = (dVar11 + dVar3) * 1.0 * (dVar1 + 1.0);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar9;
      pdVar9 = TPZVec<double>::operator[](local_20,1);
      *pdVar9 = (dVar11 + dVar3) * 1.0 * (dVar1 + 1.0);
      dVar11 = *pdVar8;
      dVar3 = *pdVar7;
      dVar1 = *pdVar8;
      dVar2 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = (dVar11 + dVar3) * (dVar1 + dVar2) * 0.5;
      break;
    case 0xe:
      *local_18 = (*pdVar9 + 1.0) * 0.5 * (1.0 - *pdVar7) * (1.0 - *pdVar7);
      dVar11 = *pdVar7;
      dVar3 = *pdVar9;
      pdVar8 = TPZVec<double>::operator[](local_20,0);
      *pdVar8 = (1.0 - dVar11) * -1.0 * (dVar3 + 1.0);
      pdVar8 = TPZVec<double>::operator[](local_20,1);
      *pdVar8 = 0.0;
      dVar11 = *pdVar7;
      dVar3 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = (1.0 - dVar11) * (1.0 - dVar3) * 0.5;
      break;
    case 0xf:
      *local_18 = (1.0 - *pdVar9) * 0.5;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = -0.5;
      break;
    case 0x10:
      *local_18 = 1.0 - *pdVar8;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = -1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 0x11:
      *local_18 = *pdVar7 + *pdVar8;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 0x12:
      *local_18 = 1.0 - *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = -1.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.0;
      break;
    case 0x13:
      *local_18 = (*pdVar9 + 1.0) * 0.5;
      pdVar7 = TPZVec<double>::operator[](local_20,0);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,1);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_20,2);
      *pdVar7 = 0.5;
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cout,
                           "Side projection is not regular and it should have been checked earlier. Aborting.."
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000350,in_stack_00000348);
    *local_18 = 0.0;
    for (local_34 = 0; lVar5 = (long)local_34, iVar6 = TPZVec<double>::size(local_20), lVar5 < iVar6
        ; local_34 = local_34 + 1) {
      pdVar7 = TPZVec<double>::operator[](local_20,(long)local_34);
      *pdVar7 = 0.0;
    }
  }
  return;
}

Assistant:

void TPZPrism::BlendFactorForSide(const int &side, const TPZVec<T> &xiVec, T &blendFactor,
                                        TPZVec<T> &blendFactorDxi){
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        blendFactor = 0;
        const REAL tol = pztopology::GetTolerance();
        #ifdef PZDEBUG
        std::ostringstream sout;
        if(side < NCornerNodes || side >= NSides){
            sout<<"The side\t"<<side<<"is invalid. Aborting..."<<std::endl;
        }

        if(!pztopology::TPZPrism::IsInParametricDomain(xiVec,tol)){
            sout<<"The method BlendFactorForSide expects the point xi to correspond to coordinates of a point";
            sout<<" inside the parametric domain. Aborting...";
        }

        if(!sout.str().empty()){
            PZError<<std::endl<<sout.str()<<std::endl;
#ifdef PZ_LOG
            LOGPZ_FATAL(logger,sout.str().c_str());
#endif
            DebugStop();
        }
        #endif
        //if the point is singular, the blend factor and its derivatives should be zero
        if(!CheckProjectionForSingularity(side,xiVec)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
            blendFactor = 0;
            for(int i = 0; i < blendFactorDxi.size(); i++) blendFactorDxi[i] = 0;
            return;
        }
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        const T &xi = xiVec[0];
        const T &eta = xiVec[1];
        const T &zeta = xiVec[2];
        switch(side){
            case  0:
            case  1:
            case  2:
            case  3:
            case  4:
            case  5:
                blendFactor = 0;
                return;
            case  6:
                blendFactor = 0.5*(1.-zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 - zeta);
                blendFactorDxi[2] = -0.5*((1 - eta)*(1 - eta));
                return;
            case  7:
                blendFactor = 0.5*(1.-zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[1] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[2] =-0.5*((eta + xi)*(eta + xi));
                return;
            case  8:
                blendFactor = 0.5*(1.-zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] =-1.*(1 - xi)*(1 - zeta);
                blendFactorDxi[1] =0;
                blendFactorDxi[2] =-0.5*((1 - xi)*(1 - xi));
                return;
            case  9:
                blendFactor = 1. - xi - eta;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 10:
                blendFactor = xi;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 11:
                blendFactor = eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 12:
                blendFactor = 0.5*(1.+zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((1 - eta)*(1 - eta));
                return;
            case 13:
                blendFactor = 0.5*(1.+zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[1] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((eta + xi)*(eta + xi));
                return;
            case 14:
                blendFactor = 0.5*(1.+zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] = -1.*(1 - xi)*(1 + zeta);
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5*((1 - xi)*(1 - xi));
                return;
            case 15:
                blendFactor = 0.5*(1.-zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = -0.5;
                return;
            case 16:
                blendFactor = 1.-eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 17:
                blendFactor = xi+eta;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 18:
                blendFactor = 1.-xi;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 19:
                blendFactor = 0.5*(1.+zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5;
                return;
        }
    }